

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_prepare_pop(Parser *this)

{
  Location loc;
  Location loc_00;
  Location loc_01;
  bool bVar1;
  error_flags eVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  long in_RDI;
  State *next;
  State *curr;
  size_t in_stack_ffffffffffffff18;
  char (*in_stack_ffffffffffffff20) [33];
  char *in_stack_ffffffffffffff28;
  Location *in_stack_ffffffffffffff30;
  size_t local_98;
  char (*in_stack_ffffffffffffff70) [33];
  char *local_88;
  Location *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff98;
  char (*in_stack_ffffffffffffffa0) [33];
  char *local_58;
  Location *pLStack_50;
  
  lVar4 = in_RDI;
  sVar3 = detail::stack<c4::yml::Parser::State,_16UL>::size
                    ((stack<c4::yml::Parser::State,_16UL> *)(in_RDI + 0x38));
  if (sVar3 < 2) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    Location::Location(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                       (size_t)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff30 = in_stack_ffffffffffffff80;
    in_stack_ffffffffffffff20 = in_stack_ffffffffffffff70;
    loc.super_LineCol.line = in_stack_ffffffffffffff88;
    loc.super_LineCol.offset = (size_t)in_stack_ffffffffffffff30;
    loc.super_LineCol.col = lVar4;
    loc.name.str = (char *)in_stack_ffffffffffffff98;
    loc.name.len = (size_t)in_stack_ffffffffffffffa0;
    in_stack_ffffffffffffff70 = in_stack_ffffffffffffff20;
    in_stack_ffffffffffffff80 = in_stack_ffffffffffffff30;
    error<33ul>(in_stack_ffffffffffffff20,loc);
    in_stack_ffffffffffffff18 = local_98;
    in_stack_ffffffffffffff28 = local_88;
  }
  if (*(long *)(in_RDI + 0x9c0) == 0) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    Location::Location(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                       (size_t)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff20 = in_stack_ffffffffffffffa0;
    in_stack_ffffffffffffff18 = in_stack_ffffffffffffff98;
    loc_00.super_LineCol.line = in_stack_ffffffffffffff88;
    loc_00.super_LineCol.offset = (size_t)in_stack_ffffffffffffff80;
    loc_00.super_LineCol.col = lVar4;
    loc_00.name.str = (char *)in_stack_ffffffffffffff18;
    loc_00.name.len = (size_t)in_stack_ffffffffffffff20;
    in_stack_ffffffffffffff98 = in_stack_ffffffffffffff18;
    in_stack_ffffffffffffffa0 = in_stack_ffffffffffffff20;
    error<25ul>((char (*) [25])in_stack_ffffffffffffff70,loc_00);
    in_stack_ffffffffffffff28 = local_58;
    in_stack_ffffffffffffff30 = pLStack_50;
  }
  lVar5 = *(long *)(in_RDI + 0x9b8) + (*(long *)(in_RDI + 0x9c0) + -1) * 0x98;
  if (*(ulong *)(in_RDI + 0x9c0) < 2) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    Location::Location(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                       (size_t)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    loc_01.super_LineCol.line = in_stack_ffffffffffffff88;
    loc_01.super_LineCol.offset = (size_t)in_stack_ffffffffffffff80;
    loc_01.super_LineCol.col = lVar4;
    loc_01.name.str = (char *)in_stack_ffffffffffffff98;
    loc_01.name.len = (size_t)in_stack_ffffffffffffffa0;
    error<25ul>((char (*) [25])in_stack_ffffffffffffff70,loc_01);
  }
  lVar4 = *(long *)(in_RDI + 0x9b8) + (*(long *)(in_RDI + 0x9c0) + -2) * 0x98;
  memcpy((void *)(lVar4 + 0x30),(void *)(lVar5 + 0x30),0x28);
  memcpy((void *)(lVar4 + 0x58),(void *)(lVar5 + 0x58),0x38);
  *(undefined8 *)(lVar4 + 0x18) = *(undefined8 *)(lVar5 + 0x18);
  *(undefined8 *)(lVar4 + 0x20) = *(undefined8 *)(lVar5 + 0x20);
  return;
}

Assistant:

void _prepare_pop()
    {
        RYML_ASSERT(m_stack.size() > 1);
        State const& curr = m_stack.top();
        State      & next = m_stack.top(1);
        next.pos = curr.pos;
        next.line_contents = curr.line_contents;
        next.scalar = curr.scalar;
    }